

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilSupp.c
# Opt level: O2

void Abc_SuppRemove(Vec_Wrd_t *p,int *pCounts,Vec_Wec_t *pS,Vec_Wec_t *pD,int iVar,int nVars)

{
  int iVar1;
  int *piVar2;
  int iVar3;
  Vec_Int_t *pVVar4;
  word wVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  
  iVar3 = Vec_WecLevelSize(pS,iVar);
  if (iVar3 != 0) {
    __assert_fail("Vec_WecLevelSize(pS, iVar) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/extra/extraUtilSupp.c"
                  ,0x1a2,
                  "void Abc_SuppRemove(Vec_Wrd_t *, int *, Vec_Wec_t *, Vec_Wec_t *, int, int)");
  }
  pVVar4 = Vec_WecEntry(pD,iVar);
  pVVar4->nSize = 0;
  uVar9 = 0;
  uVar8 = (ulong)(uint)nVars;
  if (nVars < 1) {
    uVar8 = uVar9;
  }
  do {
    if ((long)p->nSize <= (long)uVar9) {
      return;
    }
    iVar3 = (int)uVar9;
    wVar5 = Vec_WrdEntry(p,iVar3);
    if ((1L << ((byte)iVar & 0x3f) & wVar5) != 0) {
      iVar1 = pCounts[uVar9];
      pCounts[uVar9] = iVar1 + -1;
      if (iVar1 == 2) {
        uVar12 = 0;
LAB_003dbb5f:
        if (uVar12 != uVar8) {
          if ((wVar5 >> (uVar12 & 0x3f) & 1) != 0) {
            pVVar4 = Vec_WecEntry(pD,(int)uVar12);
            uVar6 = pVVar4->nSize;
            uVar10 = 0;
            if (0 < (int)uVar6) {
              uVar10 = (ulong)uVar6;
            }
            lVar7 = 1;
            for (uVar11 = 0; uVar10 != uVar11; uVar11 = uVar11 + 1) {
              piVar2 = pVVar4->pArray;
              if (uVar9 == (uint)piVar2[uVar11]) goto LAB_003dbbaf;
              lVar7 = lVar7 + 1;
            }
            if ((int)uVar6 < 0) {
              __assert_fail("i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                            ,999,"int Vec_IntRemove(Vec_Int_t *, int)");
            }
            goto LAB_003dbbbe;
          }
          goto LAB_003dbbcb;
        }
        goto LAB_003dbbd0;
      }
      if (iVar1 == 3) {
        for (uVar12 = 0; uVar8 != uVar12; uVar12 = uVar12 + 1) {
          if ((wVar5 >> (uVar12 & 0x3f) & 1) != 0) {
            Vec_WecPush(pD,(int)uVar12,iVar3);
          }
        }
      }
    }
LAB_003dbbd0:
    uVar9 = uVar9 + 1;
  } while( true );
LAB_003dbbaf:
  for (; (int)lVar7 < (int)uVar6; lVar7 = lVar7 + 1) {
    piVar2[lVar7 + -1] = piVar2[lVar7];
    uVar6 = pVVar4->nSize;
  }
  pVVar4->nSize = uVar6 - 1;
LAB_003dbbbe:
  Vec_WecPush(pS,(int)uVar12,iVar3);
LAB_003dbbcb:
  uVar12 = uVar12 + 1;
  goto LAB_003dbb5f;
}

Assistant:

void Abc_SuppRemove( Vec_Wrd_t * p, int * pCounts, Vec_Wec_t * pS, Vec_Wec_t * pD, int iVar, int nVars )
{
    word Entry; int i, v;
    assert( Vec_WecLevelSize(pS, iVar) == 0 );
    Vec_IntClear( Vec_WecEntry(pD, iVar) );
    Vec_WrdForEachEntry( p, Entry, i )
    {
        if ( ((Entry >> iVar) & 1) == 0 )
            continue;
        pCounts[i]--;
        if ( pCounts[i] == 1 )
        {
            for ( v = 0; v < nVars; v++ )
                if ( (Entry >> v) & 1 )
                {
                    Vec_IntRemove( Vec_WecEntry(pD, v), i );
                    Vec_WecPush( pS, v, i );
                }
        }
        else if ( pCounts[i] == 2 )
        {
            for ( v = 0; v < nVars; v++ )
                if ( (Entry >> v) & 1 )
                    Vec_WecPush( pD, v, i );
        }        
    }
}